

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::FormValue>::mapping(IO *IO,FormValue *FormValue)

{
  int iVar1;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [6];
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::yaml::Hex64,llvm::yaml::EmptyContext>
            (IO,"Value",&FormValue->Value,false,local_19);
  if (((FormValue->CStr).Length != 0) || (iVar1 = (*IO->_vptr_IO[2])(IO), (char)iVar1 == '\0')) {
    yaml::IO::processKey<llvm::StringRef,llvm::yaml::EmptyContext>
              (IO,"CStr",&FormValue->CStr,false,&local_1a);
  }
  if (((FormValue->BlockData).
       super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (FormValue->BlockData).
       super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
       super__Vector_impl_data._M_finish) && (iVar1 = (*IO->_vptr_IO[2])(IO), (char)iVar1 != '\0'))
  {
    return;
  }
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>,llvm::yaml::EmptyContext>
            (IO,"BlockData",&FormValue->BlockData,&local_1b);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::FormValue>::mapping(
    IO &IO, DWARFYAML::FormValue &FormValue) {
  IO.mapOptional("Value", FormValue.Value);
  if (!FormValue.CStr.empty() || !IO.outputting())
    IO.mapOptional("CStr", FormValue.CStr);
  if (!FormValue.BlockData.empty() || !IO.outputting())
    IO.mapOptional("BlockData", FormValue.BlockData);
}